

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O2

Symbol * sym_RedefString(char *symName,char *value)

{
  Symbol *pSVar1;
  char *fmt;
  
  pSVar1 = sym_FindExactSymbol(symName);
  if (pSVar1 != (Symbol *)0x0) {
    if (pSVar1->type == SYM_EQUS) {
      if (pSVar1->isBuiltin == true) {
        pSVar1 = (Symbol *)0x0;
        error("Built-in symbol \'%s\' cannot be redefined\n",symName);
      }
      else {
        updateSymbolFilename(pSVar1);
        assignStringSymbol(pSVar1,value);
      }
    }
    else {
      if (pSVar1->type == SYM_REF) {
        fmt = "\'%s\' already referenced at ";
      }
      else {
        fmt = "\'%s\' already defined as non-EQUS at ";
      }
      error(fmt,symName);
      dumpFilename(pSVar1);
      putc(10,_stderr);
      pSVar1 = (Symbol *)0x0;
    }
    return pSVar1;
  }
  pSVar1 = sym_AddString(symName,value);
  return pSVar1;
}

Assistant:

struct Symbol *sym_RedefString(char const *symName, char const *value)
{
	struct Symbol *sym = sym_FindExactSymbol(symName);

	if (!sym)
		return sym_AddString(symName, value);

	if (sym->type != SYM_EQUS) {
		if (sym_IsDefined(sym))
			error("'%s' already defined as non-EQUS at ", symName);
		else
			error("'%s' already referenced at ", symName);
		dumpFilename(sym);
		putc('\n', stderr);
		return NULL;
	} else if (sym->isBuiltin) {
		error("Built-in symbol '%s' cannot be redefined\n", symName);
		return NULL;
	}

	updateSymbolFilename(sym);
	// FIXME: this leaks the previous sym->macro value, but this can't
	// free(sym->macro) because the expansion may be redefining itself.
	assignStringSymbol(sym, value);

	return sym;
}